

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory_tests.cc
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::test::lf_edge_create_MeshFactory_p_Test::TestBody
          (lf_edge_create_MeshFactory_p_Test *this)

{
  bool bVar1;
  element_type *mesh;
  Message *message;
  char *message_00;
  char *in_R9;
  string local_78;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  shared_ptr<lf::mesh::Mesh> mesh_p;
  lf_edge_create_MeshFactory_p_Test *this_local;
  
  test_utils::GenerateHybrid2DTestMesh((test_utils *)&gtest_ar_.message_,0,1.0);
  mesh = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &gtest_ar_.message_);
  local_31 = mesh_sanity_check(mesh);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::Message::operator<<(local_50,(char (*) [31])"First test mesh with problems!")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_30,(AssertionResult *)"mesh_sanity_check(*mesh_p)",
               "false","true",in_R9);
    message_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(&local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0x46,message_00);
    testing::internal::AssertHelper::operator=(&local_58,message);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(lf_edge_create, MeshFactory_p) {
  using coord_t = Eigen::Vector2d;
  using size_type = mesh::Mesh::size_type;

  // Building the mesh
  auto mesh_p = lf::mesh::test_utils::GenerateHybrid2DTestMesh(0);

  EXPECT_TRUE(mesh_sanity_check(*mesh_p)) << "First test mesh with problems!";
}